

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

bool __thiscall UniformData::check(UniformData *this)

{
  bool bVar1;
  reference pvVar2;
  UniformData *this_local;
  
  bVar1 = std::
          queue<std::array<float,_4UL>,_std::deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
          ::empty(&this->queue);
  if (bVar1) {
    this->change = false;
  }
  else {
    pvVar2 = std::
             queue<std::array<float,_4UL>,_std::deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
             ::front(&this->queue);
    *(undefined8 *)(this->value)._M_elems = *(undefined8 *)pvVar2->_M_elems;
    *(undefined8 *)((this->value)._M_elems + 2) = *(undefined8 *)(pvVar2->_M_elems + 2);
    std::
    queue<std::array<float,_4UL>,_std::deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
    ::pop(&this->queue);
    this->change = true;
  }
  return (bool)(this->change & 1);
}

Assistant:

bool UniformData::check() {
    if (queue.empty())
        change = false;
    else {
        value = queue.front();
        queue.pop();
        change = true;
    }
    return change;
}